

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

bool __thiscall aiFace::operator==(aiFace *this,aiFace *o)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar3 = this->mIndices;
  if (puVar3 == o->mIndices) {
    return true;
  }
  if ((puVar3 != (uint *)0x0) && (this->mNumIndices == o->mNumIndices)) {
    uVar4 = 0;
    do {
      bVar5 = this->mNumIndices == uVar4;
      if (bVar5) {
        return bVar5;
      }
      puVar1 = puVar3 + uVar4;
      puVar2 = o->mIndices + uVar4;
      uVar4 = uVar4 + 1;
    } while (*puVar1 == *puVar2);
    return bVar5;
  }
  return false;
}

Assistant:

bool operator== (const aiFace& o) const {
        if (mIndices == o.mIndices) {
            return true;
        }

        if (nullptr != mIndices && mNumIndices != o.mNumIndices) {
            return false;
        }

        if (nullptr == mIndices) {
            return false;
        }

        for (unsigned int i = 0; i < this->mNumIndices; ++i) {
            if (mIndices[i] != o.mIndices[i]) {
                return false;
            }
        }

        return true;
    }